

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pset_io.c
# Opt level: O1

pset_t * read_pset_file(char *file_name,acmod_set_t *acmod_set,uint32 *n_pset)

{
  uint32 uVar1;
  int32 iVar2;
  uint uVar3;
  acmod_id_t aVar4;
  int iVar5;
  FILE *__stream;
  lineiter_t *plVar6;
  pset_t *ppVar7;
  acmod_id_t *paVar8;
  uint32 *puVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  pset_t *ppVar13;
  
  __stream = fopen(file_name,"r");
  if (__stream == (FILE *)0x0) {
    ppVar7 = (pset_t *)0x0;
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                   ,0x4a,"Unable to open %s",file_name);
  }
  else {
    plVar6 = lineiter_start((FILE *)__stream);
    uVar11 = 0;
    while (plVar6 != (lineiter_t *)0x0) {
      plVar6 = lineiter_next(plVar6);
      uVar11 = uVar11 + 1;
    }
    ppVar7 = (pset_t *)
             __ckd_calloc__((ulong)uVar11,0x28,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                            ,0x50);
    *n_pset = uVar11;
    fseek(__stream,0,0);
    uVar1 = acmod_set_n_ci(acmod_set);
    plVar6 = lineiter_start((FILE *)__stream);
    if (plVar6 != (lineiter_t *)0x0) {
      uVar11 = 0;
      do {
        iVar2 = str2words(plVar6->buf,(char **)0x0,0);
        ppVar13 = ppVar7 + uVar11;
        uVar3 = iVar2 - 1;
        ppVar7[uVar11].n_phone = uVar3;
        if (uVar3 == 0) {
          string_trim(plVar6->buf,STRING_BOTH);
          pcVar10 = strdup(plVar6->buf);
          ppVar13->name = pcVar10;
          puVar9 = (uint32 *)
                   __ckd_calloc__(4,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                                  ,0x6f);
          ppVar13->posn = puVar9;
          pcVar10 = ppVar13->name;
          iVar5 = strcmp(pcVar10,"WDBNDRY_B");
          if (iVar5 != 0) {
            iVar5 = strcmp(pcVar10,"WDBNDRY_E");
            if (iVar5 == 0) {
              puVar9 = puVar9 + 1;
            }
            else {
              iVar5 = strcmp(pcVar10,"WDBNDRY_S");
              if (iVar5 == 0) {
                puVar9 = puVar9 + 2;
              }
              else {
                iVar5 = strcmp(pcVar10,"WDBNDRY_I");
                if (iVar5 != 0) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                          ,0x7e,"Unknown null question %s\n",pcVar10);
                  exit(1);
                }
                puVar9 = puVar9 + 3;
              }
            }
          }
          *puVar9 = 1;
          ppVar13->phone = (acmod_id_t *)0x0;
        }
        else {
          paVar8 = (acmod_id_t *)
                   __ckd_calloc__((ulong)uVar3,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                                  ,0x5e);
          ppVar13->phone = paVar8;
          puVar9 = (uint32 *)
                   __ckd_calloc__((ulong)uVar1,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                                  ,0x5f);
          ppVar13->member = puVar9;
          pcVar10 = strtok(plVar6->buf," \t");
          pcVar10 = strdup(pcVar10);
          ppVar13->name = pcVar10;
          uVar12 = 0;
          do {
            pcVar10 = strtok((char *)0x0," \t");
            aVar4 = acmod_set_name2id(acmod_set,pcVar10);
            if (aVar4 == 0xffffffff) {
              err_msg(ERR_WARN,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                      ,0x65,"Unknown phone %s in set %s\n",pcVar10,ppVar13->name);
            }
            else {
              ppVar13->phone[uVar12] = aVar4;
              ppVar13->member[aVar4] = 1;
            }
            uVar12 = uVar12 + 1;
          } while (uVar3 != uVar12);
        }
        plVar6 = lineiter_next(plVar6);
        uVar11 = uVar11 + 1;
      } while (plVar6 != (lineiter_t *)0x0);
    }
  }
  return ppVar7;
}

Assistant:

pset_t *
read_pset_file(const char *file_name,
	       acmod_set_t *acmod_set,
	       uint32 *n_pset)
{
    FILE *fp;
    lineiter_t *li;
    uint32 i, j, lc, n_phone, p;
    pset_t *out;
    uint32 n_ci;

    fp = fopen(file_name, "r");

    if (fp == NULL) {
	E_ERROR_SYSTEM("Unable to open %s", file_name);
	return NULL;
    }

    for (lc = 0, li = lineiter_start(fp); li; li = lineiter_next(li), lc++);

    out = ckd_calloc(lc, sizeof(pset_t));
    *n_pset = lc;

    fseek(fp, 0L, SEEK_SET);

    n_ci = acmod_set_n_ci(acmod_set);

    for (i = 0, li = lineiter_start(fp); li; li = lineiter_next(li), i++) {

	n_phone = str2words(li->buf, NULL, 0) - 1;

	out[i].n_phone = n_phone;

	if (n_phone > 0) {
	    out[i].phone  = ckd_calloc(n_phone, sizeof(acmod_id_t));
	    out[i].member = ckd_calloc(n_ci, sizeof(uint32));
	    out[i].name = strdup(strtok(li->buf, " \t"));
	    for (j = 0; j < n_phone; j++) {
		char *phone = strtok(NULL, " \t");
		p = acmod_set_name2id(acmod_set, phone);
		if (p == NO_ACMOD) {
		    E_WARN("Unknown phone %s in set %s\n", phone, out[i].name);
		    continue;
		}
		out[i].phone[j] = (acmod_id_t)p;
		out[i].member[p] = TRUE;
	    }
	}
	else {
	    string_trim(li->buf, STRING_BOTH);
	    out[i].name = strdup(li->buf);
	    out[i].posn = ckd_calloc(N_WORD_POSN, sizeof(uint32));

	    if (strcmp(out[i].name, "WDBNDRY_B") == 0) {
		out[i].posn[(int)WORD_POSN_BEGIN] = TRUE;
	    }
	    else if (strcmp(out[i].name, "WDBNDRY_E") == 0) {
		out[i].posn[(int)WORD_POSN_END] = TRUE;
	    }
	    else if (strcmp(out[i].name, "WDBNDRY_S") == 0) {
		out[i].posn[(int)WORD_POSN_SINGLE] = TRUE;
	    }
	    else if (strcmp(out[i].name, "WDBNDRY_I") == 0) {
		out[i].posn[(int)WORD_POSN_INTERNAL] = TRUE;
	    }
	    else {
		E_FATAL("Unknown null question %s\n", out[i].name);
	    }

	    out[i].phone = NULL;
	}
    }

    return out;
}